

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gelu_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::GELU_x86_avx::forward_inplace(GELU_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [32];
  float fVar9;
  float fVar10;
  float fVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  float *pfVar18;
  long lVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar31;
  float fVar33;
  float fVar35;
  undefined1 auVar28 [16];
  float fVar30;
  float fVar32;
  float fVar34;
  float fVar36;
  float fVar37;
  float fVar38;
  undefined1 auVar29 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  
  if ((this->super_GELU).fast_gelu != 0) {
    iVar14 = bottom_top_blob->c;
    if (0 < (long)iVar14) {
      uVar16 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar17 = 0;
      do {
        auVar40._8_4_ = 0x41100000;
        auVar40._0_8_ = 0x4110000041100000;
        auVar39._8_4_ = 0xc1100000;
        auVar39._0_8_ = 0xc1100000c1100000;
        auVar40._12_4_ = 0x41100000;
        auVar39._12_4_ = 0xc1100000;
        auVar40._16_4_ = 0x41100000;
        auVar39._16_4_ = 0xc1100000;
        auVar40._20_4_ = 0x41100000;
        auVar39._20_4_ = 0xc1100000;
        auVar40._24_4_ = 0x41100000;
        auVar39._24_4_ = 0xc1100000;
        auVar40._28_4_ = 0x41100000;
        auVar39._28_4_ = 0xc1100000;
        fVar20 = 5.1222973e-08;
        fVar23 = -8.604672e-11;
        pfVar18 = (float *)(bottom_top_blob->cstep * lVar17 * bottom_top_blob->elemsize +
                           (long)bottom_top_blob->data);
        if ((int)uVar16 < 8) {
          uVar13 = 0;
        }
        else {
          iVar12 = 7;
          do {
            fVar25 = *pfVar18;
            fVar31 = pfVar18[1];
            fVar33 = pfVar18[2];
            fVar35 = pfVar18[3];
            fVar9 = pfVar18[4];
            fVar10 = pfVar18[5];
            fVar11 = pfVar18[6];
            auVar1._4_4_ = (fVar31 * fVar31 * fVar31 * 0.044715 + fVar31) * 0.7978845;
            auVar1._0_4_ = (fVar25 * fVar25 * fVar25 * 0.044715 + fVar25) * 0.7978845;
            auVar1._8_4_ = (fVar33 * fVar33 * fVar33 * 0.044715 + fVar33) * 0.7978845;
            auVar1._12_4_ = (fVar35 * fVar35 * fVar35 * 0.044715 + fVar35) * 0.7978845;
            auVar1._16_4_ = (fVar9 * fVar9 * fVar9 * 0.044715 + fVar9) * 0.7978845;
            auVar1._20_4_ = (fVar10 * fVar10 * fVar10 * 0.044715 + fVar10) * 0.7978845;
            auVar1._24_4_ = (fVar11 * fVar11 * fVar11 * 0.044715 + fVar11) * 0.7978845;
            auVar1._28_4_ = fVar23 + pfVar18[7];
            auVar1 = vmaxps_avx(auVar39,auVar1);
            auVar1 = vminps_avx(auVar40,auVar1);
            fVar23 = auVar1._0_4_;
            fVar24 = fVar23 * fVar23;
            fVar2 = auVar1._4_4_;
            fVar30 = fVar2 * fVar2;
            fVar3 = auVar1._8_4_;
            fVar32 = fVar3 * fVar3;
            fVar4 = auVar1._12_4_;
            fVar34 = fVar4 * fVar4;
            fVar5 = auVar1._16_4_;
            fVar36 = fVar5 * fVar5;
            fVar6 = auVar1._20_4_;
            fVar37 = fVar6 * fVar6;
            fVar7 = auVar1._24_4_;
            fVar38 = fVar7 * fVar7;
            auVar8._4_4_ = ((((((fVar30 * -2.7607684e-16 + 2.000188e-13) * fVar30 + -8.604672e-11) *
                               fVar30 + 5.1222973e-08) * fVar30 + 1.48572235e-05) * fVar30 +
                            0.00063726195) * fVar30 + 0.0048935246) * fVar2;
            auVar8._0_4_ = ((((((fVar24 * -2.7607684e-16 + 2.000188e-13) * fVar24 + -8.604672e-11) *
                               fVar24 + 5.1222973e-08) * fVar24 + 1.48572235e-05) * fVar24 +
                            0.00063726195) * fVar24 + 0.0048935246) * fVar23;
            auVar8._8_4_ = ((((((fVar32 * -2.7607684e-16 + 2.000188e-13) * fVar32 + -8.604672e-11) *
                               fVar32 + 5.1222973e-08) * fVar32 + 1.48572235e-05) * fVar32 +
                            0.00063726195) * fVar32 + 0.0048935246) * fVar3;
            auVar8._12_4_ =
                 ((((((fVar34 * -2.7607684e-16 + 2.000188e-13) * fVar34 + -8.604672e-11) * fVar34 +
                    5.1222973e-08) * fVar34 + 1.48572235e-05) * fVar34 + 0.00063726195) * fVar34 +
                 0.0048935246) * fVar4;
            auVar8._16_4_ =
                 ((((((fVar36 * -2.7607684e-16 + 2.000188e-13) * fVar36 + -8.604672e-11) * fVar36 +
                    5.1222973e-08) * fVar36 + 1.48572235e-05) * fVar36 + 0.00063726195) * fVar36 +
                 0.0048935246) * fVar5;
            auVar8._20_4_ =
                 ((((((fVar37 * -2.7607684e-16 + 2.000188e-13) * fVar37 + -8.604672e-11) * fVar37 +
                    5.1222973e-08) * fVar37 + 1.48572235e-05) * fVar37 + 0.00063726195) * fVar37 +
                 0.0048935246) * fVar6;
            auVar8._24_4_ =
                 ((((((fVar38 * -2.7607684e-16 + 2.000188e-13) * fVar38 + -8.604672e-11) * fVar38 +
                    5.1222973e-08) * fVar38 + 1.48572235e-05) * fVar38 + 0.00063726195) * fVar38 +
                 0.0048935246) * fVar7;
            auVar8._28_4_ = auVar1._28_4_;
            auVar29._0_4_ =
                 ((fVar24 * 1.1982584e-06 + 0.00011853471) * fVar24 + 0.0022684347) * fVar24 +
                 0.0048935246;
            auVar29._4_4_ =
                 ((fVar30 * 1.1982584e-06 + 0.00011853471) * fVar30 + 0.0022684347) * fVar30 +
                 0.0048935246;
            auVar29._8_4_ =
                 ((fVar32 * 1.1982584e-06 + 0.00011853471) * fVar32 + 0.0022684347) * fVar32 +
                 0.0048935246;
            auVar29._12_4_ =
                 ((fVar34 * 1.1982584e-06 + 0.00011853471) * fVar34 + 0.0022684347) * fVar34 +
                 0.0048935246;
            auVar29._16_4_ =
                 ((fVar36 * 1.1982584e-06 + 0.00011853471) * fVar36 + 0.0022684347) * fVar36 +
                 0.0048935246;
            auVar29._20_4_ =
                 ((fVar37 * 1.1982584e-06 + 0.00011853471) * fVar37 + 0.0022684347) * fVar37 +
                 0.0048935246;
            auVar29._24_4_ =
                 ((fVar38 * 1.1982584e-06 + 0.00011853471) * fVar38 + 0.0022684347) * fVar38 +
                 0.0048935246;
            auVar29._28_4_ = fVar20 + 0.0048935246;
            auVar1 = vdivps_avx(auVar8,auVar29);
            fVar23 = auVar1._28_4_ + 1.0;
            fVar20 = 0.5;
            *pfVar18 = fVar25 * 0.5 * (auVar1._0_4_ + 1.0);
            pfVar18[1] = fVar31 * 0.5 * (auVar1._4_4_ + 1.0);
            pfVar18[2] = fVar33 * 0.5 * (auVar1._8_4_ + 1.0);
            pfVar18[3] = fVar35 * 0.5 * (auVar1._12_4_ + 1.0);
            pfVar18[4] = fVar9 * 0.5 * (auVar1._16_4_ + 1.0);
            pfVar18[5] = fVar10 * 0.5 * (auVar1._20_4_ + 1.0);
            pfVar18[6] = fVar11 * 0.5 * (auVar1._24_4_ + 1.0);
            pfVar18[7] = pfVar18[7];
            pfVar18 = pfVar18 + 8;
            iVar12 = iVar12 + 8;
            uVar13 = uVar16 & 0xfffffff8;
          } while (iVar12 < (int)uVar16);
        }
        uVar15 = uVar13 | 3;
        while ((int)uVar15 < (int)uVar16) {
          fVar4 = *pfVar18;
          fVar5 = pfVar18[1];
          fVar6 = pfVar18[2];
          fVar7 = pfVar18[3];
          auVar21._0_4_ = (fVar4 * fVar4 * fVar4 * 0.044715 + fVar4) * 0.7978845;
          auVar21._4_4_ = (fVar5 * fVar5 * fVar5 * 0.044715 + fVar5) * 0.7978845;
          auVar21._8_4_ = (fVar6 * fVar6 * fVar6 * 0.044715 + fVar6) * 0.7978845;
          auVar21._12_4_ = (fVar7 * fVar7 * fVar7 * 0.044715 + fVar7) * 0.7978845;
          auVar26._8_4_ = 0xc1100000;
          auVar26._0_8_ = 0xc1100000c1100000;
          auVar26._12_4_ = 0xc1100000;
          auVar21 = vmaxps_avx(auVar26,auVar21);
          auVar27._8_4_ = 0x41100000;
          auVar27._0_8_ = 0x4110000041100000;
          auVar27._12_4_ = 0x41100000;
          auVar21 = vminps_avx(auVar27,auVar21);
          fVar23 = auVar21._0_4_;
          fVar25 = fVar23 * fVar23;
          fVar20 = auVar21._4_4_;
          fVar31 = fVar20 * fVar20;
          fVar2 = auVar21._8_4_;
          fVar33 = fVar2 * fVar2;
          fVar3 = auVar21._12_4_;
          fVar35 = fVar3 * fVar3;
          auVar22._0_4_ =
               ((((((fVar25 * -2.7607684e-16 + 2.000188e-13) * fVar25 + -8.604672e-11) * fVar25 +
                  5.1222973e-08) * fVar25 + 1.48572235e-05) * fVar25 + 0.00063726195) * fVar25 +
               0.0048935246) * fVar23;
          auVar22._4_4_ =
               ((((((fVar31 * -2.7607684e-16 + 2.000188e-13) * fVar31 + -8.604672e-11) * fVar31 +
                  5.1222973e-08) * fVar31 + 1.48572235e-05) * fVar31 + 0.00063726195) * fVar31 +
               0.0048935246) * fVar20;
          auVar22._8_4_ =
               ((((((fVar33 * -2.7607684e-16 + 2.000188e-13) * fVar33 + -8.604672e-11) * fVar33 +
                  5.1222973e-08) * fVar33 + 1.48572235e-05) * fVar33 + 0.00063726195) * fVar33 +
               0.0048935246) * fVar2;
          auVar22._12_4_ =
               ((((((fVar35 * -2.7607684e-16 + 2.000188e-13) * fVar35 + -8.604672e-11) * fVar35 +
                  5.1222973e-08) * fVar35 + 1.48572235e-05) * fVar35 + 0.00063726195) * fVar35 +
               0.0048935246) * fVar3;
          auVar28._0_4_ =
               ((fVar25 * 1.1982584e-06 + 0.00011853471) * fVar25 + 0.0022684347) * fVar25 +
               0.0048935246;
          auVar28._4_4_ =
               ((fVar31 * 1.1982584e-06 + 0.00011853471) * fVar31 + 0.0022684347) * fVar31 +
               0.0048935246;
          auVar28._8_4_ =
               ((fVar33 * 1.1982584e-06 + 0.00011853471) * fVar33 + 0.0022684347) * fVar33 +
               0.0048935246;
          auVar28._12_4_ =
               ((fVar35 * 1.1982584e-06 + 0.00011853471) * fVar35 + 0.0022684347) * fVar35 +
               0.0048935246;
          auVar21 = vdivps_avx(auVar22,auVar28);
          *pfVar18 = fVar4 * 0.5 * (auVar21._0_4_ + 1.0);
          pfVar18[1] = fVar5 * 0.5 * (auVar21._4_4_ + 1.0);
          pfVar18[2] = fVar6 * 0.5 * (auVar21._8_4_ + 1.0);
          pfVar18[3] = fVar7 * 0.5 * (auVar21._12_4_ + 1.0);
          pfVar18 = pfVar18 + 4;
          uVar15 = uVar13 + 7;
          uVar13 = uVar13 + 4;
        }
        if (uVar16 - uVar13 != 0 && (int)uVar13 <= (int)uVar16) {
          lVar19 = 0;
          do {
            fVar23 = pfVar18[lVar19];
            fVar20 = tanhf((fVar23 * fVar23 * 0.044715 * fVar23 + fVar23) * 0.7978845);
            pfVar18[lVar19] = (fVar20 + 1.0) * fVar23 * 0.5;
            lVar19 = lVar19 + 1;
          } while (uVar16 - uVar13 != (int)lVar19);
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != iVar14);
    }
    return 0;
  }
  iVar14 = GELU::forward_inplace(&this->super_GELU,bottom_top_blob,opt);
  return iVar14;
}

Assistant:

int GELU_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (!fast_gelu)
    {
        return GELU::forward_inplace(bottom_top_blob, opt);
    }

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int elempack = bottom_top_blob.elempack;
    int channels = bottom_top_blob.c;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _half512 = _mm512_set1_ps(0.5f);
        __m512 _one512 = _mm512_set1_ps(1.f);
        __m512 _fast1c512 = _mm512_set1_ps(0.79788452f);
        __m512 _fast2c512 = _mm512_set1_ps(0.044715f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _pLoad = _mm512_loadu_ps(ptr);

            __m512 _cube = _mm512_mul_ps(_pLoad, _pLoad);
            _cube = _mm512_mul_ps(_pLoad, _cube);

            __m512 _blob = _mm512_mul_ps(_fast2c512, _cube);
            _blob = _mm512_add_ps(_pLoad, _blob);
            _blob = _mm512_mul_ps(_fast1c512, _blob);
            _blob = tanh512_ps(_blob);
            _blob = _mm512_add_ps(_one512, _blob);

            _blob = _mm512_mul_ps(_half512, _mm512_mul_ps(_blob, _pLoad));

            _mm512_storeu_ps(ptr, _blob);

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _half256 = _mm256_set1_ps(0.5f);
        __m256 _one256 = _mm256_set1_ps(1.f);
        __m256 _fast1c256 = _mm256_set1_ps(0.79788452f);
        __m256 _fast2c256 = _mm256_set1_ps(0.044715f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _pLoad = _mm256_loadu_ps(ptr);

            __m256 _cube = _mm256_mul_ps(_pLoad, _pLoad);
            _cube = _mm256_mul_ps(_pLoad, _cube);

            __m256 _blob = _mm256_mul_ps(_fast2c256, _cube);
            _blob = _mm256_add_ps(_pLoad, _blob);
            _blob = _mm256_mul_ps(_fast1c256, _blob);
            _blob = tanh256_ps(_blob);
            _blob = _mm256_add_ps(_one256, _blob);

            _blob = _mm256_mul_ps(_half256, _mm256_mul_ps(_blob, _pLoad));

            _mm256_storeu_ps(ptr, _blob);

            ptr += 8;
        }
#endif // __AVX__
        __m128 _half128 = _mm_set1_ps(0.5f);
        __m128 _one128 = _mm_set1_ps(1.f);
        __m128 _fast1c128 = _mm_set1_ps(0.79788452f);
        __m128 _fast2c128 = _mm_set1_ps(0.044715f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _pLoad = _mm_loadu_ps(ptr);

            __m128 _cube = _mm_mul_ps(_pLoad, _pLoad);
            _cube = _mm_mul_ps(_pLoad, _cube);

            __m128 _blob = _mm_mul_ps(_fast2c128, _cube);
            _blob = _mm_add_ps(_pLoad, _blob);
            _blob = _mm_mul_ps(_fast1c128, _blob);
            _blob = tanh_ps(_blob);
            _blob = _mm_add_ps(_one128, _blob);

            _blob = _mm_mul_ps(_half128, _mm_mul_ps(_blob, _pLoad));

            _mm_storeu_ps(ptr, _blob);

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            // y = 0.5x * (1 + tanh(sqrt(2/Pi) * (x + 0.044715x^3)))
            *ptr = 0.5f * *ptr * (1.0f + tanhf(0.79788452f * (*ptr + 0.044715f * *ptr * *ptr * *ptr)));

            ptr++;
        }
    }

    return 0;
}